

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O2

bool __thiscall
Js::EquivalentTypeSet::Contains(EquivalentTypeSet *this,JITTypeHolder type,uint16 *pIndex)

{
  ushort uVar1;
  bool bVar2;
  uint16 ti;
  ushort index;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder type_local;
  
  local_48.t = type.t;
  if (this->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(this);
  }
  index = 0;
  do {
    uVar1 = this->count;
    if (uVar1 <= index) {
LAB_003f47be:
      return index < uVar1;
    }
    type_local = GetType(this,index);
    bVar2 = JITTypeHolderBase<void>::operator==(&type_local,&local_48);
    if (bVar2) {
      if (pIndex != (uint16 *)0x0) {
        *pIndex = index;
      }
      goto LAB_003f47be;
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool EquivalentTypeSet::Contains(const JITTypeHolder type, uint16* pIndex)
{
    if (!this->GetSortedAndDuplicatesRemoved())
    {
        this->SortAndRemoveDuplicates();
    }
    for (uint16 ti = 0; ti < this->count; ti++)
    {
        if (this->GetType(ti) == type)
        {
            if (pIndex)
            {
                *pIndex = ti;
            }
            return true;
        }
    }
    return false;
}